

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void CBinds::ConBinds(IResult *pResult,void *pUserData)

{
  int iVar1;
  uint uVar2;
  int *pModifier;
  IConsole *pIVar3;
  char *pcVar4;
  IInput *this;
  char *pcVar5;
  CBinds *in_RSI;
  IResult *in_RDI;
  long in_FS_OFFSET;
  int m;
  int i;
  int KeyID;
  char *pKeyName;
  CBinds *pBinds;
  int Modifier;
  char aBuf_1 [256];
  char aBuf [1024];
  int local_53c;
  uint local_538;
  CBinds *this_00;
  int local_50c;
  char local_508 [96];
  char local_408 [1024];
  long local_8;
  undefined4 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  iVar1 = IConsole::IResult::NumArguments(in_RDI);
  if (iVar1 == 1) {
    iVar1 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
    pModifier = (int *)CONCAT44(extraout_var,iVar1);
    uVar2 = DecodeBindString(this_00,(char *)in_RSI,pModifier);
    if (uVar2 == 0) {
      str_format(local_508,0x100,"key \'%s\' not found",pModifier);
      pIVar3 = CComponent::Console((CComponent *)0x1488bb);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"binds",local_508);
    }
    else {
      if (in_RSI->m_aaaKeyBindings[(int)uVar2][local_50c][0] == '\0') {
        str_format(local_508,0x100,"%s (%d) is not bound",pModifier,(ulong)uVar2);
      }
      else {
        str_format(local_508,0x100,"%s (%d) = %s",pModifier,(ulong)uVar2,
                   in_RSI->m_aaaKeyBindings[(int)uVar2] + local_50c);
      }
      pIVar3 = CComponent::Console((CComponent *)0x148978);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"binds",local_508);
    }
  }
  else {
    iVar1 = IConsole::IResult::NumArguments(in_RDI);
    if (iVar1 == 0) {
      for (local_538 = 0; (int)local_538 < 0x1da; local_538 = local_538 + 1) {
        for (local_53c = 0; local_53c < 4; local_53c = local_53c + 1) {
          if (in_RSI->m_aaaKeyBindings[(int)local_538][local_53c][0] != '\0') {
            pcVar4 = GetModifierName(local_53c);
            this = CComponent::Input((CComponent *)0x148a2a);
            pcVar5 = IInput::KeyName(this,local_538);
            str_format(local_408,0x400,"%s%s (%d) = %s",pcVar4,pcVar5,(ulong)local_538,
                       in_RSI->m_aaaKeyBindings[(int)local_538] + local_53c);
            pIVar3 = CComponent::Console((CComponent *)0x148a8a);
            (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(pIVar3,0,"binds",local_408);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CBinds::ConBinds(IConsole::IResult *pResult, void *pUserData)
{
	CBinds *pBinds = (CBinds *)pUserData;
	char aBuf[1024];
	if(pResult->NumArguments() == 1)
	{
		char aBuf[256];
		const char *pKeyName = pResult->GetString(0);

		int Modifier;
		int KeyID = pBinds->DecodeBindString(pKeyName, &Modifier);
		if(!KeyID)
		{
			str_format(aBuf, sizeof(aBuf), "key '%s' not found", pKeyName);
			pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		}
		else
		{
			if(pBinds->m_aaaKeyBindings[KeyID][Modifier][0] == 0)
				str_format(aBuf, sizeof(aBuf), "%s (%d) is not bound", pKeyName, KeyID);
			else
				str_format(
					aBuf,
					sizeof(aBuf),
					"%s (%d) = %s",
					pKeyName, KeyID, pBinds->m_aaaKeyBindings[KeyID][Modifier]
				);
			pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
		}
	}
	else if(pResult->NumArguments() == 0)
	{
		for(int i = 0; i < KEY_LAST; i++)
		{
			for(int m = 0; m < MODIFIER_COUNT; m++)
			{
				if(pBinds->m_aaaKeyBindings[i][m][0] == 0)
					continue;
				str_format(aBuf, sizeof(aBuf), "%s%s (%d) = %s", GetModifierName(m), pBinds->Input()->KeyName(i), i, pBinds->m_aaaKeyBindings[i][m]);
				pBinds->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "binds", aBuf);
			}
		}
	}
}